

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int htmlTokenizerTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  void *__ptr;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  uint size;
  uint local_94;
  char *local_90;
  uint dataState;
  char *local_80;
  char *local_78;
  xmlTokenizerConfig config;
  uint testNum;
  char startTag [31];
  
  nb_tests = nb_tests + 1;
  local_94 = options;
  pcVar2 = resultFilename(filename,temp_directory,".res");
  if (pcVar2 == (char *)0x0) {
    fwrite("out of memory\n",0xe,1,_stderr);
    fatalError();
  }
  SAXdebug = (FILE *)fopen64(pcVar2,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    fprintf(_stderr,"Failed to write to %s\n",pcVar2);
    free(pcVar2);
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s: failed to open\n",filename);
    }
    else {
      local_94 = local_94 | 2;
      uVar5 = 0;
      local_90 = filename;
      local_80 = result;
      local_78 = pcVar2;
      while (iVar1 = __isoc99_fscanf(__stream,"%u %30s %u %u%*1[\n]",&testNum,startTag,&dataState,
                                     &size), 3 < iVar1) {
        fprintf((FILE *)SAXdebug,"%d\n",uVar5);
        __ptr = (void *)(*_xmlMalloc)(size + 1);
        sVar3 = fread(__ptr,1,(ulong)size,__stream);
        if (sVar3 != size) {
          uVar5 = (ulong)((int)uVar5 + 1);
          pcVar2 = "%s:%d: unexpected eof\n";
          goto LAB_0010998f;
        }
        lVar4 = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler,0,0,0,0,1);
        config.dataState = dataState;
        config.inCharacters = 0;
        *(xmlTokenizerConfig **)(lVar4 + 0x1a8) = &config;
        *(undefined4 *)(lVar4 + 0x110) = 0x11;
        config.startTag = (xmlChar *)startTag;
        htmlCtxtUseOptions(lVar4,local_94);
        htmlParseChunk(lVar4,__ptr,size,1);
        htmlFreeParserCtxt(lVar4);
        (*_xmlFree)(__ptr);
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      iVar1 = feof(__stream);
      if (iVar1 != 0) {
        fclose(__stream);
        fclose((FILE *)SAXdebug);
        pcVar2 = local_78;
        iVar1 = compareFiles(local_78,local_80);
        if (iVar1 != 0) {
          fprintf(_stderr,"Got a difference for %s\n",local_90);
        }
        unlink(pcVar2);
        free(pcVar2);
        return (uint)(iVar1 != 0);
      }
      pcVar2 = "%s:%d: invalid format\n";
LAB_0010998f:
      fprintf(_stderr,pcVar2,local_90,uVar5);
    }
  }
  return -1;
}

Assistant:

static int
htmlTokenizerTest(const char *filename, const char *result,
                  const char *err ATTRIBUTE_UNUSED,
                  int options) {
    xmlTokenizerConfig config;
    char startTag[31];
    FILE *input;
    char *temp;
    unsigned testNum, dataState, size;
    int ret = 0, counter = 0;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }

    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr, "%s: failed to open\n", filename);
        return(-1);
    }

    while (fscanf(input, "%u %30s %u %u%*1[\n]",
                  &testNum, startTag, &dataState, &size) >= 4) {
        htmlParserCtxtPtr ctxt;
        char *data;

        fprintf(SAXdebug, "%d\n", counter++);

        data = xmlMalloc(size + 1);
        if (fread(data, 1, size, input) != size) {
            fprintf(stderr, "%s:%d: unexpected eof\n", filename, counter);
            return(-1);
        }

        ctxt = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler, NULL, NULL, 0,
                                        NULL, XML_CHAR_ENCODING_UTF8);
        config.dataState = dataState;
        config.startTag = BAD_CAST startTag;
        config.inCharacters = 0;
        ctxt->_private = &config;
        /* Skip charset auto-detection */
        ctxt->instate = XML_PARSER_XML_DECL;
        htmlCtxtUseOptions(ctxt, options | HTML_PARSE_HTML5);
        htmlParseChunk(ctxt, data, size, 1);
        htmlFreeParserCtxt(ctxt);

        xmlFree(data);
    }
    if (!feof(input)) {
        fprintf(stderr, "%s:%d: invalid format\n", filename, counter);
        return(-1);
    }

    fclose(input);
    fclose(SAXdebug);

    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}